

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.cpp
# Opt level: O1

bool __thiscall mpt::slice::shift(slice *this,ssize_t len)

{
  if (len < 0) {
    if (SBORROW8(this->_off,-len) == (long)(this->_off + len) < 0) goto LAB_0012b3ce;
  }
  else if (len <= (long)this->_len) {
LAB_0012b3ce:
    this->_len = this->_len - len;
    this->_off = this->_off + len;
    return true;
  }
  return false;
}

Assistant:

bool slice::shift(ssize_t len)
{
	if (len < 0) {
		if (-len > (ssize_t) _off) {
			return false;
		}
	}
	else if (len > (ssize_t) _len) {
		return false;
	}
	_len -= len;
	_off += len;
	return true;
}